

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FallbackSolverWrapper.cpp
# Opt level: O0

Status __thiscall
SAT::FallbackSolverWrapper::solve(FallbackSolverWrapper *this,uint conflictCountLimit)

{
  SATSolver *pSVar1;
  uint in_ESI;
  long in_RDI;
  Status status;
  Status local_10;
  
  pSVar1 = Lib::ScopedPtr<SAT::SATSolver>::operator->((ScopedPtr<SAT::SATSolver> *)(in_RDI + 8));
  local_10 = (*pSVar1->_vptr_SATSolver[5])(pSVar1,(ulong)in_ESI);
  if (local_10 == UNKNOWN) {
    pSVar1 = Lib::ScopedPtr<SAT::SATSolver>::operator->
                       ((ScopedPtr<SAT::SATSolver> *)(in_RDI + 0x10));
    local_10 = (*pSVar1->_vptr_SATSolver[5])(pSVar1,(ulong)in_ESI);
    *(undefined1 *)(in_RDI + 0x18) = 1;
    *(int *)(DAT_01333840 + 0x21c) = *(int *)(DAT_01333840 + 0x21c) + 1;
  }
  else {
    *(undefined1 *)(in_RDI + 0x18) = 0;
  }
  return local_10;
}

Assistant:

SATSolver::Status FallbackSolverWrapper::solve(unsigned conflictCountLimit)
{
  // Currently always run the _inner solver to see if we can use it
  Status status = _inner->solve(conflictCountLimit);

  // Check if we need to use _fallback
  if(status == Status::UNKNOWN){
    status = _fallback->solve(conflictCountLimit);
    _usingFallback = true;
    ASS(status != Status::UNKNOWN);
    env.statistics->smtFallbacks++;
  } 
  else{
    _usingFallback = false;
  }
  return status;
}